

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O2

RunResult wabt::interp::IntRem<long>(long lhs,long rhs,long *out,string *out_msg)

{
  long lVar1;
  RunResult RVar2;
  
  if (rhs == 0) {
    std::__cxx11::string::assign((char *)out_msg);
    RVar2 = Trap;
  }
  else {
    RVar2 = Ok;
    if (rhs == -1 && lhs == -0x8000000000000000) {
      lVar1 = 0;
    }
    else {
      lVar1 = lhs % rhs;
    }
    *out = lVar1;
  }
  return RVar2;
}

Assistant:

RunResult WABT_VECTORCALL IntRem(T lhs, T rhs, T* out, std::string* out_msg) {
  if (WABT_UNLIKELY(rhs == 0)) {
    *out_msg = "integer divide by zero";
    return RunResult::Trap;
  }
  if (WABT_LIKELY(IsNormalDivRem(lhs, rhs))) {
    *out = lhs % rhs;
  } else {
    *out = 0;
  }
  return RunResult::Ok;
}